

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O0

void google::protobuf::Option::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  Option *this;
  Option **v1;
  Option **v2;
  LogMessage *pLVar2;
  ulong uVar3;
  string *value;
  Arena *arena_00;
  uint32_t *puVar4;
  Any *pAVar5;
  basic_string_view<char,_std::char_traits<char>_> local_c8;
  LogMessageFatal local_b8 [23];
  Voidify local_a1;
  uint local_a0;
  uint32_t cached_has_bits;
  undefined1 local_90 [16];
  LogMessageFatal local_80 [23];
  Voidify local_69;
  Option *local_68;
  string *local_60;
  string *absl_log_internal_check_op_result;
  Arena *arena;
  Option *from;
  Option *_this;
  MessageLite *from_msg_local;
  MessageLite *to_msg_local;
  string *local_28;
  string *local_20;
  Option *local_18;
  anon_union_24_1_493b367e_for_Option_4 *local_10;
  
  arena = (Arena *)from_msg;
  from = (Option *)to_msg;
  _this = (Option *)from_msg;
  from_msg_local = to_msg;
  absl_log_internal_check_op_result = (string *)MessageLite::GetArena(to_msg);
  local_68 = (Option *)arena;
  v1 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Option_const*>
                 (&local_68);
  v2 = absl::lts_20240722::log_internal::GetReferenceableValue<google::protobuf::Option*>(&from);
  local_60 = absl::lts_20240722::log_internal::
             Check_NEImpl<google::protobuf::Option_const*,google::protobuf::Option*>
                       (v1,v2,"&from != _this");
  if (local_60 != (string *)0x0) {
    local_90 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_80,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/type.pb.cc"
               ,0x952,local_90._0_8_,local_90._8_8_);
    pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_80);
    absl::lts_20240722::log_internal::Voidify::operator&&(&local_69,pLVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_80);
  }
  local_a0 = 0;
  _internal_name_abi_cxx11_((Option *)arena);
  uVar3 = std::__cxx11::string::empty();
  this = from;
  if ((uVar3 & 1) == 0) {
    value = _internal_name_abi_cxx11_((Option *)arena);
    local_18 = this;
    local_10 = &this->field_0;
    local_20 = value;
    arena_00 = MessageLite::GetArena((MessageLite *)this);
    internal::ArenaStringPtr::Set<>(&(this->field_0)._impl_.name_,value,arena_00);
  }
  puVar4 = internal::HasBits<1>::operator[]((HasBits<1> *)&(arena->impl_).field_0x10,0);
  local_a0 = *puVar4;
  if ((local_a0 & 1) != 0) {
    if ((arena->impl_).head_._M_b._M_p == (__pointer_type)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_c8,"from._impl_.value_ != nullptr");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/type.pb.cc"
                 ,0x95b,local_c8._M_len,local_c8._M_str);
      pLVar2 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_b8);
      absl::lts_20240722::log_internal::Voidify::operator&&(&local_a1,pLVar2);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_b8);
    }
    if ((from->field_0)._impl_.value_ == (Any *)0x0) {
      to_msg_local = (MessageLite *)(arena->impl_).head_._M_b._M_p;
      local_28 = absl_log_internal_check_op_result;
      pAVar5 = (Any *)Arena::CopyConstruct<google::protobuf::Any>
                                ((Arena *)absl_log_internal_check_op_result,to_msg_local);
      (from->field_0)._impl_.value_ = pAVar5;
    }
    else {
      Any::MergeFrom((from->field_0)._impl_.value_,(Any *)(arena->impl_).head_._M_b._M_p);
    }
  }
  uVar1 = local_a0;
  puVar4 = internal::HasBits<1>::operator[](&(from->field_0)._impl_._has_bits_,0);
  *puVar4 = uVar1 | *puVar4;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(from->super_Message).super_MessageLite._internal_metadata_,
             (InternalMetadata *)&(arena->impl_).alloc_policy_);
  return;
}

Assistant:

void Option::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Option*>(&to_msg);
  auto& from = static_cast<const Option&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Option)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  if (!from._internal_name().empty()) {
    _this->_internal_set_name(from._internal_name());
  }
  cached_has_bits = from._impl_._has_bits_[0];
  if (cached_has_bits & 0x00000001u) {
    ABSL_DCHECK(from._impl_.value_ != nullptr);
    if (_this->_impl_.value_ == nullptr) {
      _this->_impl_.value_ =
          ::google::protobuf::Message::CopyConstruct<::google::protobuf::Any>(arena, *from._impl_.value_);
    } else {
      _this->_impl_.value_->MergeFrom(*from._impl_.value_);
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}